

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

void __thiscall
RenX_ServerListPlugin::addServerToServerList(RenX_ServerListPlugin *this,Server *server)

{
  size_type sVar1;
  string local_58;
  undefined1 local_38 [8];
  string server_json_block;
  Server *server_local;
  RenX_ServerListPlugin *this_local;
  
  server_json_block.field_2._8_8_ = server;
  std::__cxx11::string::string((string *)local_38);
  server_as_json_abi_cxx11_(&local_58,this,(Server *)server_json_block.field_2._8_8_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,&local_58
            );
  std::__cxx11::string::~string((string *)&local_58);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->m_server_list_json);
  if (sVar1 < 3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_server_list_json,'[');
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&this->m_server_list_json);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->m_server_list_json,',');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->m_server_list_json,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->m_server_list_json,']');
  updateMetadata(this);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void RenX_ServerListPlugin::addServerToServerList(RenX::Server &server) {
	std::string server_json_block;

	// append to server_list_json
	server_json_block = server_as_json(server);
	if (m_server_list_json.size() <= 2) {
		m_server_list_json = '[';
	}
	else {
		m_server_list_json.pop_back(); // remove trailing ']'.
		m_server_list_json += ',';
	}
	m_server_list_json += server_json_block;
	m_server_list_json += ']';

	// Also update metadata so it reflects the now added server
	updateMetadata();
}